

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O1

void DepParserTask::extract_features(search *sch,uint32_t idx,multi_ex *ec)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  byte *pbVar4;
  example_predict *peVar5;
  v_array<unsigned_int> *pvVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint64_t mask;
  long lVar10;
  example *peVar11;
  undefined4 uVar12;
  size_t i;
  uint32_t *puVar13;
  ulong uVar14;
  uint64_t offset;
  features *this;
  uint64_t multiplier;
  size_t j;
  byte *pbVar15;
  long lVar16;
  long lVar17;
  float new_weight;
  size_t new_count;
  float local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  vw *local_60;
  example *local_58;
  v_array<unsigned_int> *local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  local_60 = Search::search::get_vw_pointer_unsafe(sch);
  plVar2 = (long *)sch->task_data;
  puVar3 = (undefined8 *)*plVar2;
  puVar3[0xd14] = 0;
  *(undefined4 *)((long)puVar3 + 0x68b4) = 0;
  pbVar4 = (byte *)puVar3[1];
  for (pbVar15 = (byte *)*puVar3; pbVar15 != pbVar4; pbVar15 = pbVar15 + 1) {
    features::clear((features *)(puVar3 + (ulong)*pbVar15 * 0xd + 4));
  }
  mask = Search::search::get_mask(sch);
  puVar13 = &(local_60->weights).dense_weights._stride_shift;
  if ((local_60->weights).sparse != false) {
    puVar13 = &(local_60->weights).sparse_weights._stride_shift;
  }
  multiplier = (ulong)local_60->wpp << ((byte)*puVar13 & 0x3f);
  local_40 = plVar2[0x13];
  local_48 = plVar2[0x14];
  if (local_40 == local_48) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(uint *)(local_48 + -4);
  }
  local_50 = (v_array<unsigned_int> *)(plVar2 + 0x1f);
  local_58 = (example *)*plVar2;
  local_68 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  plVar2[0x55] = 0;
  plVar2[0x56] = 0;
  plVar2[0x53] = 0;
  plVar2[0x54] = 0;
  plVar2[0x51] = 0;
  plVar2[0x52] = 0;
  plVar2[0x4f] = 0;
  plVar2[0x50] = 0;
  plVar2[0x4d] = 0;
  plVar2[0x4e] = 0;
  plVar2[0x4b] = 0;
  plVar2[0x4c] = 0;
  plVar2[0x57] = 0;
  lVar10 = -4;
  uVar14 = 0;
  do {
    if ((uVar14 < (ulong)(plVar2[0x14] - plVar2[0x13] >> 2)) &&
       (iVar7 = *(int *)(plVar2[0x14] + lVar10), iVar7 != 0)) {
      peVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar7 - 1];
    }
    else {
      peVar11 = (example *)0x0;
    }
    plVar2[uVar14 + 0x4b] = (long)peVar11;
    uVar14 = uVar14 + 1;
    lVar10 = lVar10 + -4;
  } while (uVar14 != 3);
  local_70 = (ulong)idx;
  lVar10 = 0;
  do {
    if ((local_70 - 1) + lVar10 < local_68) {
      peVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[local_70 + lVar10 + -1];
    }
    else {
      peVar11 = (example *)0x0;
    }
    plVar2[lVar10 + 0x4e] = (long)peVar11;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_78 = (ulong)uVar8;
  lVar10 = -0x20;
  do {
    if ((uVar8 != 0 && local_40 != local_48) &&
       (iVar7 = *(int *)(*(long *)((long)plVar2 + lVar10 * 4 + 600) + local_78 * 4), iVar7 != 0)) {
      *(example **)((long)plVar2 + lVar10 + 0x2a8) =
           (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[iVar7 - 1];
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0);
  lVar10 = -0x10;
  do {
    if ((local_68 < local_70) ||
       (iVar7 = *(int *)(*(long *)((long)plVar2 + lVar10 * 4 + 0x218) + local_70 * 4), iVar7 == 0))
    {
      peVar11 = (example *)0x0;
    }
    else {
      peVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar7 - 1];
    }
    *(example **)((long)plVar2 + lVar10 + 0x2b8) = peVar11;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0);
  if ((((ulong)(plVar2[0x14] - plVar2[0x13]) < 5) ||
      (uVar14 = (ulong)*(uint *)(plVar2[0x14] + -8), uVar14 == 0)) ||
     (iVar7 = *(int *)(plVar2[0x3b] + uVar14 * 4), iVar7 == 0)) {
    peVar11 = (example *)0x0;
  }
  else {
    peVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar7 - 1];
  }
  plVar2[0x57] = (long)peVar11;
  uVar14 = multiplier * 0x1a1d5191;
  this = (local_58->super_example_predict).feature_space + 0x42;
  lVar10 = 0x4b;
  offset = 0;
  do {
    if ((example *)plVar2[lVar10] == (example *)0x0) {
      features::push_back(this,1.0,uVar14 & mask);
    }
    else {
      add_all_features(local_58,(example *)plVar2[lVar10],(char)lVar10 + 0xf7,mask,multiplier,offset
                       ,false);
    }
    pvVar6 = local_50;
    lVar10 = lVar10 + 1;
    uVar14 = uVar14 + multiplier * 0x5416d;
    offset = offset + 0x5416d;
    this = this + 1;
  } while (lVar10 != 0x58);
  v_array<unsigned_int>::resize(local_50,10);
  if (local_40 == local_48) {
    *pvVar6->_begin = 0;
    uVar8 = 1;
  }
  else {
    iVar7 = 1;
    if (local_70 <= local_68) {
      uVar9 = 5;
      if (idx - uVar8 < 5) {
        uVar9 = idx - uVar8;
      }
      iVar7 = uVar9 + 2;
    }
    *(int *)plVar2[0x1f] = iVar7;
    uVar9 = *(uint *)(plVar2[0x33] + local_78 * 4);
    uVar8 = 5;
    if (uVar9 < 5) {
      uVar8 = uVar9;
    }
    uVar8 = uVar8 + 1;
  }
  pvVar6->_begin[1] = uVar8;
  uVar9 = 1;
  uVar8 = 1;
  if (local_40 != local_48) {
    uVar1 = *(uint *)(plVar2[0x37] + local_78 * 4);
    uVar8 = 5;
    if (uVar1 < 5) {
      uVar8 = uVar1;
    }
    uVar8 = uVar8 + 1;
  }
  pvVar6->_begin[2] = uVar8;
  if (local_70 <= local_68) {
    uVar8 = *(uint *)(plVar2[0x33] + local_70 * 4);
    uVar9 = 5;
    if (uVar8 < 5) {
      uVar9 = uVar8;
    }
    uVar9 = uVar9 + 1;
  }
  pvVar6->_begin[3] = uVar9;
  lVar10 = 0x3b;
  do {
    uVar12 = 0xf;
    if ((local_40 != local_48) &&
       (uVar14 = (ulong)*(uint *)(plVar2[lVar10] + local_78 * 4), uVar14 != 0)) {
      uVar12 = *(undefined4 *)(plVar2[0x1b] + uVar14 * 4);
    }
    *(undefined4 *)((long)pvVar6->_begin + lVar10 + -0x2b) = uVar12;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x4b);
  lVar10 = 0x3b;
  do {
    uVar12 = 0xf;
    if ((local_70 <= local_68) &&
       (uVar14 = (ulong)*(uint *)(plVar2[lVar10] + local_70 * 4), uVar14 != 0)) {
      uVar12 = *(undefined4 *)(plVar2[0x1b] + uVar14 * 4);
    }
    *(undefined4 *)((long)pvVar6->_begin + lVar10 + -0x1b) = uVar12;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x43);
  peVar5 = &local_58->super_example_predict;
  lVar10 = 0x20d8e94;
  lVar17 = 0;
  lVar16 = 0;
  do {
    lVar10 = lVar10 + lVar17;
    features::push_back(peVar5->feature_space + 100,1.0,
                        ((ulong)local_50->_begin[lVar16] + lVar10) * multiplier & mask);
    lVar16 = lVar16 + 1;
    lVar17 = lVar17 + 0x3ff;
  } while (lVar16 != 10);
  puVar3 = (undefined8 *)*plVar2;
  pbVar15 = (byte *)*puVar3;
  if (pbVar15 == (byte *)puVar3[1]) {
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    do {
      uVar14 = uVar14 + ((long)(puVar3[(ulong)*pbVar15 * 0xd + 5] -
                               puVar3[(ulong)*pbVar15 * 0xd + 4]) >> 2);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != (byte *)puVar3[1]);
  }
  INTERACTIONS::eval_count_of_generated_ft(local_60,(example *)*plVar2,&local_38,&local_7c);
  *(size_t *)(*plVar2 + 0x68a0) = local_38 + uVar14;
  *(float *)(*plVar2 + 0x68b4) = (float)uVar14 + local_7c;
  return;
}

Assistant:

void extract_features(Search::search &sch, uint32_t idx, multi_ex &ec)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = sch.get_task_data<task_data>();
  reset_ex(data->ex);
  uint64_t mask = sch.get_mask();
  uint64_t multiplier = (uint64_t)all.wpp << all.weights.stride_shift();

  v_array<uint32_t> &stack = data->stack, &tags = data->tags, *children = data->children, &temp = data->temp;
  example **ec_buf = data->ec_buf;
  example &ex = *(data->ex);

  size_t n = ec.size();
  bool empty = stack.empty();
  size_t last = empty ? 0 : stack.last();

  for (size_t i = 0; i < 13; i++) ec_buf[i] = nullptr;

  // feature based on the top three examples in stack ec_buf[0]: s1, ec_buf[1]: s2, ec_buf[2]: s3
  for (size_t i = 0; i < 3; i++)
    ec_buf[i] = (stack.size() > i && *(stack.end() - (i + 1)) != 0) ? ec[*(stack.end() - (i + 1)) - 1] : 0;

  // features based on examples in string buffer ec_buf[3]: b1, ec_buf[4]: b2, ec_buf[5]: b3
  for (size_t i = 3; i < 6; i++) ec_buf[i] = (idx + (i - 3) - 1 < n) ? ec[idx + i - 3 - 1] : 0;

  // features based on the leftmost and the rightmost children of the top element stack ec_buf[6]: sl1, ec_buf[7]: sl2,
  // ec_buf[8]: sr1, ec_buf[9]: sr2;
  for (size_t i = 6; i < 10; i++)
    if (!empty && last != 0 && children[i - 4][last] != 0)
      ec_buf[i] = ec[children[i - 4][last] - 1];

  // features based on leftmost children of the top element in bufer ec_buf[10]: bl1, ec_buf[11]: bl2
  for (size_t i = 10; i < 12; i++)
    ec_buf[i] = (idx <= n && children[i - 8][idx] != 0) ? ec[children[i - 8][idx] - 1] : 0;
  ec_buf[12] = (stack.size() > 1 && *(stack.end() - 2) != 0 && children[2][*(stack.end() - 2)] != 0)
      ? ec[children[2][*(stack.end() - 2)] - 1]
      : 0;

  // unigram features
  for (size_t i = 0; i < 13; i++)
  {
    uint64_t additional_offset = (uint64_t)(i * offset_const);
    if (!ec_buf[i])
      add_feature(ex, (uint64_t)438129041 + additional_offset, (unsigned char)((i + 1) + 'A'), mask, multiplier);
    else
      add_all_features(ex, *ec_buf[i], 'A' + (unsigned char)(i + 1), mask, multiplier, additional_offset, false);
  }

  // Other features
  temp.resize(10);
  temp[0] = empty ? 0 : (idx > n ? 1 : 2 + min(5, idx - (uint32_t)last));
  temp[1] = empty ? 1 : 1 + min(5, children[0][last]);
  temp[2] = empty ? 1 : 1 + min(5, children[1][last]);
  temp[3] = idx > n ? 1 : 1 + min(5, children[0][idx]);
  for (size_t i = 4; i < 8; i++) temp[i] = (!empty && children[i - 2][last] != 0) ? tags[children[i - 2][last]] : 15;
  for (size_t i = 8; i < 10; i++) temp[i] = (idx <= n && children[i - 6][idx] != 0) ? tags[children[i - 6][idx]] : 15;

  uint64_t additional_offset = val_namespace * offset_const;
  for (size_t j = 0; j < 10; j++)
  {
    additional_offset += j * 1023;
    add_feature(ex, temp[j] + additional_offset, val_namespace, mask, multiplier);
  }
  size_t count = 0;
  for (features fs : *data->ex)
  {
    fs.sum_feat_sq = (float)fs.size();
    count += fs.size();
  }

  size_t new_count;
  float new_weight;
  INTERACTIONS::eval_count_of_generated_ft(all, *data->ex, new_count, new_weight);

  data->ex->num_features = count + new_count;
  data->ex->total_sum_feat_sq = (float)count + new_weight;
}